

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Server_setVariableNode_valueCallback
          (UA_Server *server,UA_NodeId nodeId,UA_ValueCallback callback)

{
  UA_NodeStoreEntry *pUVar1;
  UA_StatusCode UVar2;
  UA_NodeStoreEntry **ppUVar3;
  
  ppUVar3 = findNode(server->nodestore,&nodeId);
  if (ppUVar3 == (UA_NodeStoreEntry **)0x0) {
    UVar2 = 0x80340000;
  }
  else {
    pUVar1 = *ppUVar3;
    UVar2 = 0x805f0000;
    if ((pUVar1->node).nodeClass == UA_NODECLASS_VARIABLE) {
      pUVar1[2].node.nodeId.identifier.string.length = (size_t)callback.onWrite;
      pUVar1[2].orig = (UA_NodeStoreEntry *)callback.handle;
      *(_func_void_void_ptr_UA_NodeId_UA_Variant_ptr_UA_NumericRange_ptr **)&pUVar1[2].node.nodeId =
           callback.onRead;
      UVar2 = 0;
    }
  }
  return UVar2;
}

Assistant:

UA_StatusCode
UA_Server_setVariableNode_valueCallback(UA_Server *server, const UA_NodeId nodeId,
                                        const UA_ValueCallback callback) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setValueCallback, &callback);
    UA_RCU_UNLOCK();
    return retval;
}